

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManWriter.cpp
# Opt level: O0

bool __thiscall adios2::core::engine::DataManWriter::IsBufferQueueEmpty(DataManWriter *this)

{
  byte bVar1;
  mutex_type *in_RDI;
  lock_guard<std::mutex> l;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
             ,in_RDI);
  bVar1 = std::
          queue<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::deque<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>_>
          ::empty((queue<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::deque<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>_>
                   *)0xe411b3);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xe411c3);
  return (bool)(bVar1 & 1);
}

Assistant:

bool DataManWriter::IsBufferQueueEmpty()
{
    std::lock_guard<std::mutex> l(m_BufferQueueMutex);
    return m_BufferQueue.empty();
}